

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::evaluateCollocationConstraint
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *constraintValue)

{
  element_type *peVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  pointer pcVar8;
  ostringstream errorMsg;
  char *local_280 [5];
  PointerType local_258;
  long lStack_250;
  undefined1 local_248;
  PointerType local_238;
  long lStack_230;
  undefined1 local_228;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_218;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_200;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1e8;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1d0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  local_1a0 [2];
  
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar6 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar8 = (psVar6->_M_dataplus)._M_p;
    pcVar7 = "Dynamical system not set.";
LAB_001a822e:
    iDynTree::reportError(pcVar8,"evaluateCollocationConstraint",pcVar7);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        sVar3 = iDynTree::VectorDynSize::size();
        sVar4 = DynamicalSystem::stateSpaceSize
                          ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (sVar3 != sVar4) {
          DynamicalSystem::stateSpaceSize
                    ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          iDynTree::VectorDynSize::resize((ulong)constraintValue);
        }
        peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar2 = (*peVar1->_vptr_DynamicalSystem[3])
                          (peVar1,(controlInputs->
                                  super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar2 == '\0') {
LAB_001a81f2:
          psVar6 = IntegratorInfo::name_abi_cxx11_
                             (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar8 = (psVar6->_M_dataplus)._M_p;
          pcVar7 = "Error while setting the control input.";
        }
        else {
          peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar2 = (*peVar1->_vptr_DynamicalSystem[2])
                            (SUB84(time,0),peVar1,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,&this->m_computationBuffer);
          if ((char)iVar2 != '\0') {
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[3])
                              (peVar1,(controlInputs->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20);
            if ((char)iVar2 == '\0') goto LAB_001a81f2;
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[2])
                              (SUB84(time + dT,0),peVar1,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + 0x20,
                               &this->m_computationBuffer2);
            if ((char)iVar2 != '\0') {
              toEigen(&local_1b8,
                      (collocationPoints->
                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start + 0x20);
              local_228 = local_1b8.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          ._16_1_;
              local_238 = local_1b8.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_230 = local_1b8.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              toEigen(&local_1d0,
                      (collocationPoints->
                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start);
              local_248 = local_1d0.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          ._16_1_;
              local_258 = local_1d0.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_250 = local_1d0.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              toEigen(&local_1e8,&this->m_computationBuffer);
              toEigen(&local_200,&this->m_computationBuffer2);
              local_1a0[0].m_rhs.m_rhs.m_lhs._0_8_ = local_1e8._0_8_;
              local_1a0[0].m_rhs.m_rhs.m_lhs._8_8_ = local_1e8._8_8_;
              local_1a0[0].m_rhs.m_rhs.m_lhs._16_1_ = local_1e8._16_1_;
              local_1a0[0].m_lhs.m_lhs.m_xpr.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_238;
              local_1a0[0].m_lhs.m_lhs.m_xpr.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = lStack_230;
              local_1a0[0].m_lhs.m_lhs.m_xpr.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_ = local_228;
              local_1a0[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_258;
              local_1a0[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = lStack_250;
              local_1a0[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_ = local_248;
              local_1a0[0].m_rhs.m_lhs.m_rows.m_value = local_200._8_8_;
              local_1a0[0].m_rhs.m_rhs.m_rhs._0_8_ = local_200._0_8_;
              local_1a0[0].m_rhs.m_rhs.m_rhs._8_8_ = local_200._8_8_;
              local_1a0[0].m_rhs.m_rhs.m_rhs._16_1_ = local_200._16_1_;
              local_1a0[0].m_rhs.m_lhs.m_functor.m_other = dT * 0.5;
              toEigen(&local_218,constraintValue);
              Eigen::internal::
              call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>const>const>>
                        (&local_218,local_1a0);
              return true;
            }
          }
          psVar6 = IntegratorInfo::name_abi_cxx11_
                             (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar8 = (psVar6->_M_dataplus)._M_p;
          pcVar7 = "Error while evaluating the dynamical system.";
        }
        goto LAB_001a822e;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "The size of the matrix containing the control inputs does not match the expected one. Input = "
                     );
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::operator<<(poVar5,", Expected = 2.");
      psVar6 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar7,"evaluateCollocationConstraint",local_280[0]);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::operator<<((ostream *)local_1a0,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::operator<<(poVar5,", Expected = 2.");
      psVar6 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar7 = (psVar6->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar7,"evaluateCollocationConstraint",local_280[0]);
    }
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraint(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                    const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                    VectorDynSize &constraintValue)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (constraintValue.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    constraintValue.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[0], time, m_computationBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[1], time+dT, m_computationBuffer2))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                toEigen(constraintValue) = -toEigen(collocationPoints[1]) + toEigen(collocationPoints[0]) +
                        dT/2.0*(toEigen(m_computationBuffer)+toEigen(m_computationBuffer2));

                return true;
            }